

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Detail::anon_unknown_0::
StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL>::~StreamBufImpl
          (StreamBufImpl<Catch::Detail::(anonymous_namespace)::OutputDebugWriter,_256UL> *this)

{
  ~StreamBufImpl(this);
  operator_delete(this,0x148);
  return;
}

Assistant:

int overflow(int c) override {
          sync();

          if (c != EOF) {
            if (pbase() == epptr())
              m_writer(std::string(1, static_cast<char>(c)));
            else
              sputc(static_cast<char>(c));
          }
          return 0;
        }